

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O2

MortonCode64 __thiscall Resorting::MortonCode64::InvertDimension<2>(MortonCode64 *this)

{
  ulong uVar1;
  
  uVar1 = this->data;
  return (MortonCode64)((-(uVar1 & xMask << 2) ^ uVar1) & xMask << 2 ^ uVar1);
}

Assistant:

MortonCode64 MortonCode64::InvertDimension() const
{
    static_assert(
        0 <= DIM && DIM < 3, "The dimension must be between 0 and 2.");
    uint64_t mask = xMask << DIM;

    //(2 - complement)
    // invert bits
    uint64_t c = data ^ mask;
    // add 1
    uint64_t sum = (c | ~mask) + 1; // fill the bits that are not in the mask
                                    // with 1 to make sure carry gets carried on
    return MortonCode64((sum & mask) | (c & ~mask));
}